

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  CartesianProduct merged;
  RobotManifold robot2;
  RobotManifold robot1;
  CartesianProduct se3;
  RealSpace R3;
  S2 s2;
  RealSpace R8;
  SO3<mnf::ExpMapQuaternion> so3;
  code *local_4c0 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_468;
  void *local_450;
  void *local_438;
  undefined **local_420 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_3c8;
  void *local_3b0;
  void *local_398;
  RealSpace *local_380;
  SO3<mnf::ExpMapQuaternion> *local_378;
  undefined **local_370 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_318;
  void *local_300;
  void *local_2e8;
  code *local_2d0 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_278;
  void *local_260;
  void *local_248;
  code *local_230 [11];
  void *local_1d8;
  void *local_1c8;
  S2 local_1b8 [136];
  code *local_130 [11];
  void *local_d8;
  void *local_c8;
  SO3<mnf::ExpMapQuaternion> local_b8;
  
  mnf::CartesianProduct::CartesianProduct((CartesianProduct *)local_4c0);
  mnf::RealSpace::RealSpace((RealSpace *)local_130,8);
  mnf::RealSpace::RealSpace((RealSpace *)local_230,3);
  mnf::S2::S2(local_1b8);
  mnf::SO3<mnf::ExpMapQuaternion>::SO3(&local_b8);
  mnf::CartesianProduct::CartesianProduct((CartesianProduct *)local_370);
  local_370[0] = &PTR__CartesianProduct_0010e9d8;
  mnf::CartesianProduct::multiply((Manifold *)local_370);
  mnf::Manifold::display();
  mnf::CartesianProduct::CartesianProduct((CartesianProduct *)local_420);
  local_420[0] = &PTR__CartesianProduct_0010e9d8;
  local_380 = (RealSpace *)local_230;
  local_378 = &local_b8;
  mnf::CartesianProduct::CartesianProduct((CartesianProduct *)local_2d0,&local_380,2);
  mnf::CartesianProduct::multiply((Manifold *)local_420);
  mnf::Manifold::display();
  mnf::CartesianProduct::multiply((Manifold *)local_4c0);
  mnf::Manifold::display();
  mnf::CartesianProduct::multiply((Manifold *)local_4c0);
  mnf::CartesianProduct::multiply((Manifold *)local_4c0);
  mnf::CartesianProduct::multiply((Manifold *)local_4c0);
  mnf::CartesianProduct::multiply((Manifold *)local_4c0);
  mnf::CartesianProduct::multiply((Manifold *)local_4c0);
  mnf::Manifold::display();
  local_2d0[0] = mnf::CartesianProduct::applyInvTransport_;
  if (local_248 != (void *)0x0) {
    operator_delete(local_248);
  }
  if (local_260 != (void *)0x0) {
    operator_delete(local_260);
  }
  std::
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  ::~vector(&local_278);
  mnf::Manifold::~Manifold((Manifold *)local_2d0);
  local_420[0] = (undefined **)mnf::CartesianProduct::applyInvTransport_;
  if (local_398 != (void *)0x0) {
    operator_delete(local_398);
  }
  if (local_3b0 != (void *)0x0) {
    operator_delete(local_3b0);
  }
  std::
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  ::~vector(&local_3c8);
  mnf::Manifold::~Manifold((Manifold *)local_420);
  local_370[0] = (undefined **)mnf::CartesianProduct::applyInvTransport_;
  if (local_2e8 != (void *)0x0) {
    operator_delete(local_2e8);
  }
  if (local_300 != (void *)0x0) {
    operator_delete(local_300);
  }
  std::
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  ::~vector(&local_318);
  mnf::Manifold::~Manifold((Manifold *)local_370);
  local_b8._0_8_ = &PTR__SO3_0010ebd0;
  mnf::ReusableTemporaryMap::~ReusableTemporaryMap((ReusableTemporaryMap *)((long)&local_b8 + 0x58))
  ;
  mnf::Manifold::~Manifold(&local_b8.super_Manifold);
  mnf::Manifold::~Manifold((Manifold *)local_1b8);
  local_230[0] = mnf::CartesianProduct::diffRetractation_;
  free(local_1c8);
  free(local_1d8);
  mnf::Manifold::~Manifold((Manifold *)local_230);
  local_130[0] = mnf::CartesianProduct::diffRetractation_;
  free(local_c8);
  free(local_d8);
  mnf::Manifold::~Manifold((Manifold *)local_130);
  local_4c0[0] = mnf::CartesianProduct::applyInvTransport_;
  if (local_438 != (void *)0x0) {
    operator_delete(local_438);
  }
  if (local_450 != (void *)0x0) {
    operator_delete(local_450);
  }
  std::
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  ::~vector(&local_468);
  mnf::Manifold::~Manifold((Manifold *)local_4c0);
  return 0;
}

Assistant:

int main()
{
  CartesianProduct merged;
  RealSpace R8(8);
  RealSpace R3(3);
  S2 s2;
  SO3<ExpMapQuaternion> so3;
  RobotManifold robot1;
  robot1.multiply(R8);
  robot1.display();
  RobotManifold robot2;
  CartesianProduct se3{&R3, &so3};
  robot2.multiply(se3);
  robot2.display();
  merged.multiply(robot1);
  merged.display();
  merged.multiply(robot2);
  merged.multiply(s2);
  merged.multiply(R3);
  merged.multiply(s2);
  merged.multiply(R3);
  merged.display();
  return 0;
}